

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  XMLError error_00;
  ostream *poVar3;
  char *filename_00;
  exception *e;
  VulkanHppGenerator generator;
  undefined1 local_388 [4];
  XMLError error;
  XMLDocument doc;
  int local_78;
  allocator<char> local_71;
  int i;
  string filename;
  allocator<char> local_39;
  undefined1 local_38 [8];
  string api;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  api.field_2._8_8_ = argv;
  if (argc % 2 == 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,
                             "VulkanHppGenerator usage: VulkanHppGenerator [-f filename][-api [vulkan|vulkansc]]"
                            );
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<((ostream *)&std::cout,"\tdefault for filename is <");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/Vulkan-Headers/registry/vk.xml"
                            );
    poVar3 = std::operator<<(poVar3,">");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<((ostream *)&std::cout,"\tdefault for api <vulkan>");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<((ostream *)&std::cout,
                             "\tsupported values for api are <vulkan> and <vulkansc>");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    argv_local._4_4_ = -1;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_38,"vulkan",&local_39);
    std::allocator<char>::~allocator(&local_39);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&i,
               "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/Vulkan-Headers/registry/vk.xml"
               ,&local_71);
    std::allocator<char>::~allocator(&local_71);
    for (local_78 = 1; local_78 < argc; local_78 = local_78 + 2) {
      iVar2 = strcmp(*(char **)(api.field_2._8_8_ + (long)local_78 * 8),"-api");
      if (iVar2 == 0) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                   *(char **)(api.field_2._8_8_ + 8 + (long)local_78 * 8));
      }
      else {
        iVar2 = strcmp(*(char **)(api.field_2._8_8_ + (long)local_78 * 8),"-f");
        if (iVar2 != 0) {
          poVar3 = std::operator<<((ostream *)&std::cout,"unsupported argument <");
          poVar3 = std::operator<<(poVar3,*(char **)(api.field_2._8_8_ + (long)local_78 * 8));
          poVar3 = std::operator<<(poVar3,">");
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          argv_local._4_4_ = -1;
          doc._commentPool._nUntracked = 1;
          goto LAB_0020d86a;
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i,
                   *(char **)(api.field_2._8_8_ + 8 + (long)local_78 * 8));
      }
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_38,"vulkan");
    if ((((bVar1 ^ 0xffU) & 1) == 0) ||
       (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_38,"vulkansc"), ((bVar1 ^ 0xffU) & 1) == 0)) {
      std::operator<<((ostream *)&std::cout,
                      "VulkanHppGenerator: could not find clang-format. The generated files will not be formatted accordingly.\n"
                     );
      tinyxml2::XMLDocument::XMLDocument((XMLDocument *)local_388,true,PRESERVE_WHITESPACE);
      poVar3 = std::operator<<((ostream *)&std::cout,"VulkanHppGenerator: Loading ");
      poVar3 = std::operator<<(poVar3,(string *)&i);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      filename_00 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i)
      ;
      error_00 = tinyxml2::XMLDocument::LoadFile((XMLDocument *)local_388,filename_00);
      if (error_00 == XML_SUCCESS) {
        poVar3 = std::operator<<((ostream *)&std::cout,"VulkanHppGenerator: Parsing ");
        poVar3 = std::operator<<(poVar3,(string *)&i);
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        VulkanHppGenerator::VulkanHppGenerator
                  ((VulkanHppGenerator *)&e,(XMLDocument *)local_388,(string *)local_38);
        VulkanHppGenerator::prepareRAIIHandles((VulkanHppGenerator *)&e);
        VulkanHppGenerator::generateCppModuleFile((VulkanHppGenerator *)&e);
        VulkanHppGenerator::generateHppFile((VulkanHppGenerator *)&e);
        VulkanHppGenerator::generateEnumsHppFile((VulkanHppGenerator *)&e);
        VulkanHppGenerator::generateExtensionInspectionFile((VulkanHppGenerator *)&e);
        VulkanHppGenerator::generateFormatTraitsHppFile((VulkanHppGenerator *)&e);
        VulkanHppGenerator::generateFuncsHppFile((VulkanHppGenerator *)&e);
        VulkanHppGenerator::generateHandlesHppFile((VulkanHppGenerator *)&e);
        VulkanHppGenerator::generateHashHppFile((VulkanHppGenerator *)&e);
        VulkanHppGenerator::generateMacrosFile((VulkanHppGenerator *)&e);
        VulkanHppGenerator::generateSharedHppFile((VulkanHppGenerator *)&e);
        VulkanHppGenerator::generateStaticAssertionsHppFile((VulkanHppGenerator *)&e);
        VulkanHppGenerator::generateStructsHppFile((VulkanHppGenerator *)&e);
        VulkanHppGenerator::generateToStringHppFile((VulkanHppGenerator *)&e);
        VulkanHppGenerator::distributeSecondLevelCommands((VulkanHppGenerator *)&e);
        VulkanHppGenerator::generateRAIIHppFile((VulkanHppGenerator *)&e);
        VulkanHppGenerator::~VulkanHppGenerator((VulkanHppGenerator *)&e);
      }
      else {
        poVar3 = std::operator<<((ostream *)&std::cout,"VulkanHppGenerator: failed to load file ");
        poVar3 = std::operator<<(poVar3,(string *)&i);
        poVar3 = std::operator<<(poVar3," with error <");
        toString_abi_cxx11_((string *)((long)&generator.m_vulkanLicenseHeader.field_2 + 8),error_00)
        ;
        poVar3 = std::operator<<(poVar3,(string *)
                                        (generator.m_vulkanLicenseHeader.field_2._M_local_buf + 8));
        poVar3 = std::operator<<(poVar3,">");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string
                  ((string *)(generator.m_vulkanLicenseHeader.field_2._M_local_buf + 8));
        argv_local._4_4_ = -1;
      }
      doc._commentPool._nUntracked = (int)(error_00 != XML_SUCCESS);
      tinyxml2::XMLDocument::~XMLDocument((XMLDocument *)local_388);
    }
    else {
      poVar3 = std::operator<<((ostream *)&std::cout,"unsupported api <");
      poVar3 = std::operator<<(poVar3,(string *)local_38);
      poVar3 = std::operator<<(poVar3,">");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      argv_local._4_4_ = -1;
      doc._commentPool._nUntracked = 1;
    }
LAB_0020d86a:
    std::__cxx11::string::~string((string *)&i);
    std::__cxx11::string::~string((string *)local_38);
  }
  return argv_local._4_4_;
}

Assistant:

int main( int argc, char const ** argv )
{
  if ( ( argc % 2 ) == 0 )
  {
    std::cout << "VulkanHppGenerator usage: VulkanHppGenerator [-f filename][-api [vulkan|vulkansc]]" << std::endl;
    std::cout << "\tdefault for filename is <" << VK_SPEC << ">" << std::endl;
    std::cout << "\tdefault for api <vulkan>" << std::endl;
    std::cout << "\tsupported values for api are <vulkan> and <vulkansc>" << std::endl;
    return -1;
  }

  std::string api      = "vulkan";
  std::string filename = VK_SPEC;
  for ( int i = 1; i < argc; i += 2 )
  {
    if ( strcmp( argv[i], "-api" ) == 0 )
    {
      api = argv[i + 1];
    }
    else if ( strcmp( argv[i], "-f" ) == 0 )
    {
      filename = argv[i + 1];
    }
    else
    {
      std::cout << "unsupported argument <" << argv[i] << ">" << std::endl;
      return -1;
    }
  }

  if ( ( api != "vulkan" ) && ( api != "vulkansc" ) )
  {
    std::cout << "unsupported api <" << api << ">" << std::endl;
    return -1;
  }

#if defined( CLANG_FORMAT_EXECUTABLE )
  std::cout << "VulkanHppGenerator: Found ";
  std::string commandString = "\"" CLANG_FORMAT_EXECUTABLE "\" --version ";
  const int   ret           = std::system( commandString.c_str() );
  if ( ret != 0 )
  {
    std::cout << "VulkanHppGenerator: failed to determine clang_format version with error <" << ret << ">\n";
  }
#else
  std::cout << "VulkanHppGenerator: could not find clang-format. The generated files will not be formatted accordingly.\n";
#endif

  tinyxml2::XMLDocument doc;
  std::cout << "VulkanHppGenerator: Loading " << filename << std::endl;
  const tinyxml2::XMLError error = doc.LoadFile( filename.c_str() );
  if ( error != tinyxml2::XML_SUCCESS )
  {
    std::cout << "VulkanHppGenerator: failed to load file " << filename << " with error <" << toString( error ) << ">" << std::endl;
    return -1;
  }

  try
  {
    std::cout << "VulkanHppGenerator: Parsing " << filename << std::endl;
    VulkanHppGenerator generator( doc, api );

    generator.prepareRAIIHandles();
    generator.generateCppModuleFile();
    generator.generateHppFile();
    generator.generateEnumsHppFile();
    generator.generateExtensionInspectionFile();
    generator.generateFormatTraitsHppFile();
    generator.generateFuncsHppFile();
    generator.generateHandlesHppFile();
    generator.generateHashHppFile();
    generator.generateMacrosFile();
    generator.generateSharedHppFile();
    generator.generateStaticAssertionsHppFile();
    generator.generateStructsHppFile();
    generator.generateToStringHppFile();

    // this modifies the generator data and needs to be done after all the other generations are done
    generator.distributeSecondLevelCommands();
    generator.generateRAIIHppFile();
  }
  catch ( std::exception const & e )
  {
    std::cout << "caught exception: " << e.what() << std::endl;
    return -1;
  }
  catch ( ... )
  {
    std::cout << "caught unknown exception" << std::endl;
    return -1;
  }
}